

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O2

size_t wabt::cat_compute_size<char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
                 (char (*t) [5],
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                 char (*args_1) [5],
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                 char (*args_3) [3])

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = strlen(*t);
  sVar2 = cat_compute_size<std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
                    (args,args_1,args_2,args_3);
  return sVar2 + sVar1;
}

Assistant:

size_t cat_compute_size(const T& t, const Ts&... args) {
    return string_view(t).size() + cat_compute_size(args...);
}